

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O1

void wasm::Fuzzer::printTypes(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  bool bVar1;
  Printed PVar2;
  Printed PVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar4;
  char cVar5;
  ostream *poVar6;
  long *plVar7;
  pointer pHVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  char cVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar15;
  undefined8 uStack_228;
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print;
  Printed local_190;
  Printed local_168;
  undefined1 local_140 [8];
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  seen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  undefined1 local_c8 [16];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_80;
  HeapType local_78;
  string __str;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  __node_base local_31;
  FatalTypeNameGenerator fatalGenerator;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Built ",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," types:\n",8);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  print.defaultGenerator.arrayCount =
       (size_t)&print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
  uStack_228 = 0;
  print.defaultGenerator.funcCount = 0;
  print.defaultGenerator.structCount = 0;
  print.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
  print.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
  print.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  print.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
  print.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
  print.defaultGenerator.nameCache._M_h._M_single_bucket = &local_31;
  print.fallback = (FatalTypeNameGenerator *)&print.names._M_h._M_rehash_policy._M_next_resize;
  print.names._M_h._M_buckets = (__buckets_ptr)0x1;
  print.names._M_h._M_bucket_count = 0;
  print.names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  print.names._M_h._M_element_count._0_4_ = 0x3f800000;
  print.names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  print.names._M_h._M_rehash_policy._4_4_ = 0;
  print.names._M_h._M_rehash_policy._M_next_resize = 0;
  pHVar8 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = types;
  if ((types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar8) {
    uVar13 = 0;
    do {
      cVar12 = '\x01';
      if (9 < uVar13) {
        uVar10 = uVar13;
        cVar5 = '\x04';
        do {
          cVar12 = cVar5;
          if (uVar10 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00158605;
          }
          if (uVar10 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00158605;
          }
          if (uVar10 < 10000) goto LAB_00158605;
          bVar1 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar5 = cVar12 + '\x04';
        } while (bVar1);
        cVar12 = cVar12 + '\x01';
      }
LAB_00158605:
      local_78.id = (uintptr_t)&__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78.id,(uint)__str._M_dataplus._M_p,uVar13);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_78,0,(char *)0x0,(ulong)local_e8[0]);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_48 = *plVar11;
        uStack_40 = (undefined4)plVar7[3];
        uStack_3c = *(undefined4 *)((long)plVar7 + 0x1c);
        __str.field_2._8_8_ = &local_48;
      }
      else {
        local_48 = *plVar11;
        __str.field_2._8_8_ = (long *)*plVar7;
      }
      lVar9 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      auVar14 = wasm::IString::interned(lVar9,__str.field_2._8_8_,0);
      local_b8._M_buckets = &local_b8._M_single_bucket;
      local_b8._M_bucket_count = 1;
      local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_b8._M_element_count = 0;
      local_b8._M_rehash_policy._M_max_load_factor = 1.0;
      local_b8._M_rehash_policy._4_4_ = 0;
      local_b8._M_rehash_policy._M_next_resize = 0;
      local_b8._M_single_bucket = (__node_base_ptr)0x0;
      local_140 = (undefined1  [8])pHVar8[uVar13].id;
      seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      seen._M_h._M_element_count = 1;
      seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      seen._M_h._M_rehash_policy._4_4_ = 0;
      seen._M_h._M_rehash_policy._M_next_resize = 0;
      seen._M_h._M_single_bucket = (__node_base_ptr)0x3f800000;
      local_f0._M_h = (__hashtable_alloc *)&seen._M_h._M_before_begin;
      seen._M_h._0_16_ = auVar14;
      local_c8 = auVar14;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_f0._M_h,&local_b8,&local_f0);
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&print.fallback,local_140);
      pvVar4 = local_80;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&seen._M_h._M_before_begin);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_b8);
      if ((long *)__str.field_2._8_8_ != &local_48) {
        operator_delete((void *)__str.field_2._8_8_,local_48 + 1);
      }
      if ((size_type *)local_78.id != &__str._M_string_length) {
        operator_delete((void *)local_78.id,__str._M_string_length + 1);
      }
      uVar13 = uVar13 + 1;
      pHVar8 = (pvVar4->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(pvVar4->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3)
            );
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  pvVar4 = local_80;
  local_140 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
  seen._M_h._M_buckets = (__buckets_ptr)0x1;
  seen._M_h._M_bucket_count = 0;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count = CONCAT44(seen._M_h._M_element_count._4_4_,0x3f800000);
  seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seen._M_h._M_rehash_policy._4_4_ = 0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  pHVar8 = (local_80->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_80->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar8) {
    uVar13 = 0;
    do {
      local_78.id = pHVar8[uVar13].id;
      if (0xd < local_78.id) {
        lVar9 = wasm::HeapType::getRecGroup();
        if ((local_c8[8] != '\x01') || (lVar9 != local_c8._0_8_)) {
          if (local_c8[8] != '\0') {
            uVar10 = wasm::RecGroup::size();
            if (1 < uVar10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")\n",2);
            }
          }
          local_c8._0_8_ = wasm::HeapType::getRecGroup();
          if (local_c8[8] == '\0') {
            local_c8[8] = 1;
          }
          if (local_c8[8] == '\x01') {
            uVar10 = wasm::RecGroup::size();
            if (1 < uVar10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(rec\n",5);
            }
          }
        }
      }
      if (local_c8[8] == '\x01') {
        uVar10 = wasm::RecGroup::size();
        if (1 < uVar10) {
          __str.field_2._M_local_buf[8] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,__str.field_2._M_local_buf + 8,1);
        }
      }
      if (local_78.id < 0xe) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(type $",7);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        __str.field_2._M_local_buf[8] = 0x20;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,__str.field_2._M_local_buf + 8,1);
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                  (&local_190,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_> *
                   )&uStack_228,local_78);
        PVar2.generateName.super__Function_base._M_functor._M_unused._M_member_pointer =
             print.defaultGenerator.funcCount;
        PVar2.typeID = uStack_228;
        PVar2.generateName.super__Function_base._M_functor._8_8_ =
             print.defaultGenerator.structCount;
        PVar2.generateName.super__Function_base._M_manager =
             (_Manager_type)print.defaultGenerator.arrayCount;
        PVar2.generateName._M_invoker =
             (_Invoker_type)print.defaultGenerator.nameCache._M_h._M_buckets;
        poVar6 = (ostream *)wasm::operator<<(poVar6,PVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
        if (local_190.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_190.generateName.super__Function_base._M_manager)
                    ((_Any_data *)&local_190.generateName,(_Any_data *)&local_190.generateName,
                     __destroy_functor);
        }
      }
      else {
        __str.field_2._8_8_ = local_78.id;
        pVar15 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_140,(undefined1 *)((long)&__str.field_2 + 8));
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(type $",7);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," identical to $",0xf);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        }
        else {
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>::operator()
                    (&local_168,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<FatalTypeNameGenerator>_>
                      *)&uStack_228,local_78);
          PVar3.generateName.super__Function_base._M_functor._M_unused._M_member_pointer =
               print.defaultGenerator.funcCount;
          PVar3.typeID = uStack_228;
          PVar3.generateName.super__Function_base._M_functor._8_8_ =
               print.defaultGenerator.structCount;
          PVar3.generateName.super__Function_base._M_manager =
               (_Manager_type)print.defaultGenerator.arrayCount;
          PVar3.generateName._M_invoker =
               (_Invoker_type)print.defaultGenerator.nameCache._M_h._M_buckets;
          wasm::operator<<((ostream *)&std::cout,PVar3);
          if (local_168.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_168.generateName.super__Function_base._M_manager)
                      ((_Any_data *)&local_168.generateName,(_Any_data *)&local_168.generateName,
                       __destroy_functor);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      uVar13 = uVar13 + 1;
      pHVar8 = (pvVar4->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(pvVar4->
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3)
            );
  }
  if (local_c8[8] == '\x01') {
    uVar13 = wasm::RecGroup::size();
    if (1 < uVar13) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")\n",2);
    }
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.fallback);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.defaultGenerator.arrayCount);
  return;
}

Assistant:

void Fuzzer::printTypes(const std::vector<HeapType>& types) {
  std::cout << "Built " << types.size() << " types:\n";
  struct FatalTypeNameGenerator
    : TypeNameGeneratorBase<FatalTypeNameGenerator> {
    TypeNames getNames(HeapType type) {
      Fatal() << "trying to print unknown heap type";
    }
  } fatalGenerator;
  IndexedTypeNameGenerator<FatalTypeNameGenerator> print(types, fatalGenerator);
  std::unordered_map<HeapType, size_t> seen;
  std::optional<RecGroup> currRecGroup;
  auto inRecGroup = [&]() { return currRecGroup && currRecGroup->size() > 1; };
  for (size_t i = 0; i < types.size(); ++i) {
    auto type = types[i];
    if (!type.isBasic() && type.getRecGroup() != currRecGroup) {
      if (inRecGroup()) {
        std::cout << ")\n";
      }
      currRecGroup = type.getRecGroup();
      if (inRecGroup()) {
        std::cout << "(rec\n";
      }
    }
    if (inRecGroup()) {
      std::cout << ' ';
    }
    if (type.isBasic()) {
      std::cout << "(type $" << i << ' ' << print(type) << ")\n";
      continue;
    }
    auto [it, inserted] = seen.insert({type, i});
    if (inserted) {
      std::cout << print(type);
    } else {
      std::cout << "(type $" << i << " identical to $" << it->second << ")";
    }
    std::cout << "\n";
  }
  if (inRecGroup()) {
    std::cout << ")\n";
  }
}